

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Animatable<tinyusdz::value::texcoord2f>::get
          (Animatable<tinyusdz::value::texcoord2f> *this,double t,texcoord2f *v,
          TimeSampleInterpolationType tinerp)

{
  bool bVar1;
  
  if ((v == (texcoord2f *)0x0) || (this->_blocked != false)) {
LAB_002aad6c:
    bVar1 = false;
  }
  else {
    if ((!NAN(t)) || (this->_has_value != true)) {
      bVar1 = has_timesamples(this);
      if (bVar1) {
        bVar1 = TypedTimeSamples<tinyusdz::value::texcoord2f>::
                get<tinyusdz::value::texcoord2f,_nullptr>(&this->_ts,v,t,tinerp);
        return bVar1;
      }
      if ((this->_has_value != true) || (this->_blocked != false)) goto LAB_002aad6c;
    }
    *v = this->_value;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool get(double t, T *v,
           const value::TimeSampleInterpolationType tinerp =
               value::TimeSampleInterpolationType::Linear) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        (*v) = _value;
        return true;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinerp);
    }
    
    if (has_default()) {
      return get_scalar(v);
    }

    return false;
  }